

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

cupdlp_int nrminfindex(cupdlp_int n,double *x,cupdlp_int incx)

{
  double tmp;
  int i;
  cupdlp_int index;
  double nrm;
  cupdlp_int incx_local;
  double *x_local;
  cupdlp_int n_local;
  
  nrm = 0.0;
  index = 0;
  for (i = 0; i < n; i = i + 1) {
    if (nrm < ABS(x[i])) {
      index = i;
      nrm = ABS(x[i]);
    }
  }
  return index;
}

Assistant:

cupdlp_int nrminfindex(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;
  cupdlp_int index = 0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) {
      nrm = tmp;
      index = i;
    }
  }

  return index;
#else
  return dnrminfindex(n, x, incx);
#endif
}